

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cf-h2-proxy.c
# Opt level: O2

void cf_h2_proxy_adjust_pollset(Curl_cfilter *cf,Curl_easy *data,easy_pollset *ps)

{
  undefined8 *puVar1;
  nghttp2_session *session;
  curl_socket_t sock;
  int32_t iVar2;
  int32_t iVar3;
  int iVar4;
  _Bool want_recv;
  _Bool want_send;
  _Bool local_3b;
  _Bool local_3a;
  byte local_39;
  undefined8 local_38;
  
  puVar1 = (undefined8 *)cf->ctx;
  sock = Curl_conn_cf_get_socket(cf,data);
  Curl_pollset_check(data,ps,sock,&local_3b,&local_3a);
  session = (nghttp2_session *)*puVar1;
  if (session == (nghttp2_session *)0x0) {
    return;
  }
  if ((local_3b == false) && (local_3a != true)) {
    return;
  }
  local_38 = *(undefined8 *)((long)cf->ctx + 8);
  *(Curl_easy **)((long)cf->ctx + 8) = data;
  iVar2 = nghttp2_session_get_remote_window_size(session);
  if (*(int32_t *)(puVar1 + 0x24) < 0) {
    local_3b = (_Bool)(iVar2 == 0 | local_3b);
LAB_005e06ff:
    if (iVar2 == 0 || local_3a != false) goto LAB_005e071f;
  }
  else {
    local_39 = iVar2 == 0;
    iVar3 = nghttp2_session_get_stream_remote_window_size
                      ((nghttp2_session *)*puVar1,*(int32_t *)(puVar1 + 0x24));
    local_3b = (_Bool)(iVar3 == 0 | local_39 | local_3b);
    if (iVar3 != 0) goto LAB_005e06ff;
    if (iVar2 == 0) {
      local_3a = false;
      goto LAB_005e071f;
    }
  }
  iVar4 = nghttp2_session_want_write((nghttp2_session *)*puVar1);
  local_3a = iVar4 != 0;
LAB_005e071f:
  Curl_pollset_set(data,ps,sock,(_Bool)(local_3b & 1),local_3a);
  *(undefined8 *)((long)cf->ctx + 8) = local_38;
  return;
}

Assistant:

static void cf_h2_proxy_adjust_pollset(struct Curl_cfilter *cf,
                                       struct Curl_easy *data,
                                       struct easy_pollset *ps)
{
  struct cf_h2_proxy_ctx *ctx = cf->ctx;
  curl_socket_t sock = Curl_conn_cf_get_socket(cf, data);
  bool want_recv, want_send;

  Curl_pollset_check(data, ps, sock, &want_recv, &want_send);
  if(ctx->h2 && (want_recv || want_send)) {
    struct cf_call_data save;
    bool c_exhaust, s_exhaust;

    CF_DATA_SAVE(save, cf, data);
    c_exhaust = !nghttp2_session_get_remote_window_size(ctx->h2);
    s_exhaust = ctx->tunnel.stream_id >= 0 &&
                !nghttp2_session_get_stream_remote_window_size(
                   ctx->h2, ctx->tunnel.stream_id);
    want_recv = (want_recv || c_exhaust || s_exhaust);
    want_send = (!s_exhaust && want_send) ||
                (!c_exhaust && nghttp2_session_want_write(ctx->h2));

    Curl_pollset_set(data, ps, sock, want_recv, want_send);
    CF_DATA_RESTORE(cf, save);
  }
}